

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writePESPacket(TSMuxer *this)

{
  uint8_t uVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  uint8_t *puVar10;
  pointer ppVar11;
  size_type sVar12;
  reference pvVar13;
  uint8_t *puVar14;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_PMTIndexData>_>::value,_pair<iterator,_bool>_>
  _Var15;
  PMTIndex *local_170;
  size_t local_160;
  undefined1 local_140 [8];
  undefined1 local_138 [8];
  _Base_ptr local_128;
  PMTIndex *curIndex_2;
  uint8_t *blockPtr;
  pair<int,_int> *i;
  iterator __end2;
  iterator __begin2;
  PriorityDataInfo *__range2;
  bool payloadStart;
  uint8_t *dataEnd;
  uint8_t *curPtr;
  PMTIndexData local_d0;
  pair<unsigned_long,_PMTIndexData> local_c8;
  undefined1 local_b8 [8];
  _Base_ptr local_a8;
  PMTIndex *curIndex_1;
  undefined1 local_98;
  PMTIndexData local_90;
  pair<unsigned_long,_PMTIndexData> local_88;
  undefined1 local_78 [8];
  _Base_ptr local_68;
  PMTIndex *curIndex;
  SimplePacketizerReader *aCodec;
  size_t sStack_50;
  bool SPSRequired;
  MPEGStreamReader *vCodec;
  size_t idxSize;
  uint64_t curPts;
  PESPacket *pPStack_30;
  bool updateIdx;
  PESPacket *pesPacket;
  PMTStreamInfo *streamInfo;
  size_t size;
  TSMuxer *pTStack_10;
  uint32_t tsPackets;
  TSMuxer *this_local;
  
  pTStack_10 = this;
  sVar9 = MemoryBlock::size(&this->m_pesData);
  if (sVar9 != 0) {
    size._4_4_ = 0;
    sVar9 = MemoryBlock::size(&this->m_pesData);
    streamInfo = (PMTStreamInfo *)(sVar9 - 6);
    if (streamInfo < (PMTStreamInfo *)0x10000) {
      uVar2 = (ulong)streamInfo >> 8;
      puVar10 = MemoryBlock::data(&this->m_pesData);
      puVar10[4] = (uint8_t)uVar2;
      uVar1 = (uint8_t)streamInfo;
      puVar10 = MemoryBlock::data(&this->m_pesData);
      puVar10[5] = uVar1;
    }
    pesPacket = (PESPacket *)
                std::
                map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                ::operator[](&(this->m_pmt).pidList,&this->m_pesPID);
    pPStack_30 = (PESPacket *)MemoryBlock::data(&this->m_pesData);
    curPts._7_1_ = 0;
    if (((this->m_computeMuxStats & 1U) != 0) && ((pPStack_30->flagsLo & 0x80) == 0x80)) {
      idxSize = PESPacket::getPts(pPStack_30);
      vCodec = (MPEGStreamReader *)
               std::
               vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ::size((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                       *)&pesPacket[0x10].m_pesHeaderLen);
      if (vCodec == (MPEGStreamReader *)0x0) {
        std::
        vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
        ::emplace_back<>((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                          *)&pesPacket[0x10].m_pesHeaderLen);
      }
      if (*(long *)&pesPacket[0x13].m_pesPacketLenLo == 0) {
        local_160 = 0;
      }
      else {
        local_160 = __dynamic_cast(*(long *)&pesPacket[0x13].m_pesPacketLenLo,
                                   &AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo,0);
      }
      sStack_50 = local_160;
      bVar4 = (**(code **)(**(long **)&pesPacket[0x13].m_pesPacketLenLo + 0x90))();
      aCodec._7_1_ = bVar4 & 1;
      if (*(long *)&pesPacket[0x13].m_pesPacketLenLo == 0) {
        local_170 = (PMTIndex *)0x0;
      }
      else {
        local_170 = (PMTIndex *)
                    __dynamic_cast(*(long *)&pesPacket[0x13].m_pesPacketLenLo,
                                   &AbstractStreamReader::typeinfo,&SimplePacketizerReader::typeinfo
                                   ,0);
      }
      curIndex = local_170;
      if ((sStack_50 == 0) || ((this->m_pesIFrame & 1U) == 0)) {
        if (local_170 != (PMTIndex *)0x0) {
          if ((uint)this->m_videoTrackCnt + (uint)this->m_videoSecondTrackCnt == 0) {
            this->m_lastGopNullCnt = this->m_nullCnt;
          }
          std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::rbegin((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    *)&stack0xffffffffffffff50);
          local_a8 = (_Base_ptr)
                     std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                     ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                                  *)&stack0xffffffffffffff50);
          vCodec = (MPEGStreamReader *)
                   std::
                   map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                   ::size((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                           *)local_a8);
          sVar9 = idxSize;
          bVar6 = true;
          if (vCodec != (MPEGStreamReader *)0x0) {
            std::
            map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
            ::rbegin((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                      *)local_b8);
            ppVar11 = std::
                      reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                      ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                                    *)local_b8);
            bVar6 = 89999 < sVar9 - ppVar11->first;
          }
          p_Var3 = local_a8;
          if (bVar6) {
            sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (&this->m_muxedPacketCnt);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&this->m_muxedPacketCnt,sVar12 - 1);
            PMTIndexData::PMTIndexData(&local_d0,*pvVar13,0);
            local_c8 = std::make_pair<unsigned_long&,PMTIndexData>(&idxSize,&local_d0);
            std::
            map<unsigned_long,PMTIndexData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
            ::insert<std::pair<unsigned_long,PMTIndexData>>
                      ((map<unsigned_long,PMTIndexData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                        *)p_Var3,&local_c8);
            curPts._7_1_ = 1;
          }
        }
      }
      else {
        if (((this->m_pesSpsPps & 1U) != 0) || ((aCodec._7_1_ & 1) == 0)) {
          std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::rbegin((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    *)&stack0xffffffffffffff90);
          local_68 = (_Base_ptr)
                     std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                     ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                                  *)&stack0xffffffffffffff90);
          bVar5 = std::
                  map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                  ::empty((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                           *)local_68);
          sVar9 = idxSize;
          bVar6 = true;
          if (!bVar5) {
            std::
            map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
            ::rbegin((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                      *)local_78);
            ppVar11 = std::
                      reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                      ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                                    *)local_78);
            bVar6 = ppVar11->first < sVar9;
          }
          p_Var3 = local_68;
          if (bVar6) {
            sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (&this->m_muxedPacketCnt);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&this->m_muxedPacketCnt,sVar12 - 1);
            PMTIndexData::PMTIndexData(&local_90,*pvVar13,0);
            local_88 = std::make_pair<unsigned_long&,PMTIndexData>(&idxSize,&local_90);
            _Var15 = std::
                     map<unsigned_long,PMTIndexData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                     ::insert<std::pair<unsigned_long,PMTIndexData>>
                               ((map<unsigned_long,PMTIndexData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                                 *)p_Var3,&local_88);
            curIndex_1 = (PMTIndex *)_Var15.first._M_node;
            local_98 = _Var15.second;
            curPts._7_1_ = 1;
          }
        }
        this->m_lastGopNullCnt = this->m_nullCnt;
      }
    }
    puVar10 = MemoryBlock::data(&this->m_pesData);
    sVar9 = MemoryBlock::size(&this->m_pesData);
    __range2._7_1_ = true;
    __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       (&this->m_priorityData);
    i = (pair<int,_int> *)
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                  (&this->m_priorityData);
    dataEnd = puVar10;
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                       *)&i), bVar6) {
      blockPtr = (uint8_t *)
                 __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end2);
      puVar14 = MemoryBlock::data(&this->m_pesData);
      curIndex_2 = (PMTIndex *)(puVar14 + *(int *)blockPtr);
      if (dataEnd < curIndex_2) {
        iVar7 = writeTSFrames(this,this->m_pesPID,dataEnd,(long)curIndex_2 - (long)dataEnd,false,
                              __range2._7_1_);
        size._4_4_ = iVar7 + size._4_4_;
        __range2._7_1_ = false;
      }
      iVar7 = writeTSFrames(this,this->m_pesPID,(uint8_t *)curIndex_2,(long)*(int *)(blockPtr + 4),
                            true,__range2._7_1_);
      size._4_4_ = iVar7 + size._4_4_;
      dataEnd = &(curIndex_2->_M_t)._M_impl.field_0x0 + *(int *)(blockPtr + 4);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&__end2);
    }
    iVar7 = writeTSFrames(this,this->m_pesPID,dataEnd,(int64_t)(puVar10 + (sVar9 - (long)dataEnd)),
                          false,__range2._7_1_);
    size._4_4_ = iVar7 + size._4_4_;
    MemoryBlock::resize(&this->m_pesData,0);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
              (&this->m_priorityData);
    if ((curPts._7_1_ & 1) != 0) {
      std::
      vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ::rbegin((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                *)&stack0xfffffffffffffed0);
      local_128 = (_Base_ptr)
                  std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_*,_std::vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>_>_>
                               *)&stack0xfffffffffffffed0);
      std::
      map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
      ::rbegin((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                *)local_138);
      ppVar11 = std::
                reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                              *)local_138);
      if ((ppVar11->second).m_frameLen != 0) {
        __assert_fail("curIndex.rbegin()->second.m_frameLen == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x347,"void TSMuxer::writePESPacket()");
      }
      iVar8 = size._4_4_ + 1;
      iVar7 = this->m_frameSize;
      std::
      map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
      ::rbegin((map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                *)local_140);
      ppVar11 = std::
                reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                              *)local_140);
      (ppVar11->second).m_frameLen = iVar8 * iVar7;
    }
  }
  return;
}

Assistant:

void TSMuxer::writePESPacket()
{
    if (m_pesData.size() > 0)
    {
        uint32_t tsPackets = 0;

        const size_t size = m_pesData.size() - 6;
        if (size <= 0xffff)
        {
            m_pesData.data()[4] = static_cast<uint8_t>(size / 256);
            m_pesData.data()[5] = static_cast<uint8_t>(size % 256);
        }

        PMTStreamInfo& streamInfo = m_pmt.pidList[m_pesPID];
        const auto pesPacket = reinterpret_cast<PESPacket*>(m_pesData.data());
        bool updateIdx = false;
        if (m_computeMuxStats && (pesPacket->flagsLo & 0x80) == 0x80)
        {
            uint64_t curPts = pesPacket->getPts();

            size_t idxSize = streamInfo.m_index.size();
            if (idxSize == 0)
                streamInfo.m_index.emplace_back();
            const auto vCodec = dynamic_cast<MPEGStreamReader*>(streamInfo.m_codecReader);
            // bool isH264 = dynamic_cast <H264StreamReader*> (streamInfo.m_codecReader);
            const bool SPSRequired = streamInfo.m_codecReader->needSPSForSplit();
            const auto aCodec = dynamic_cast<SimplePacketizerReader*>(streamInfo.m_codecReader);
            if (vCodec && m_pesIFrame)
            {
                // skip some I-frames for H.264 if no SPS/PPS in a gop
                if (m_pesSpsPps || !SPSRequired)
                {
                    PMTIndex& curIndex = *streamInfo.m_index.rbegin();
                    if (curIndex.empty() || curPts > curIndex.rbegin()->first)
                    {
                        curIndex.insert(
                            std::make_pair(curPts, PMTIndexData(m_muxedPacketCnt[m_muxedPacketCnt.size() - 1], 0)));
                        updateIdx = true;
                    }
                }

                m_lastGopNullCnt = m_nullCnt;
            }
            else if (aCodec)
            {
                if (m_videoTrackCnt + m_videoSecondTrackCnt == 0)
                {
                    m_lastGopNullCnt = m_nullCnt;
                }
                PMTIndex& curIndex = *streamInfo.m_index.rbegin();
                idxSize = curIndex.size();
                if (idxSize == 0 || curPts - curIndex.rbegin()->first >= 90000)
                {
                    curIndex.insert(
                        std::make_pair(curPts, PMTIndexData(m_muxedPacketCnt[m_muxedPacketCnt.size() - 1], 0)));
                    updateIdx = true;
                }
            }
        }

        const uint8_t* curPtr = m_pesData.data();
        const uint8_t* dataEnd = curPtr + m_pesData.size();
        bool payloadStart = true;
        for (const auto& i : m_priorityData)
        {
            const uint8_t* blockPtr = m_pesData.data() + i.first;
            if (blockPtr > curPtr)
            {
                tsPackets += writeTSFrames(m_pesPID, curPtr, blockPtr - curPtr, false, payloadStart);
                payloadStart = false;
            }
            tsPackets += writeTSFrames(m_pesPID, blockPtr, i.second, true, payloadStart);
            curPtr = blockPtr + i.second;
        }
        tsPackets += writeTSFrames(m_pesPID, curPtr, dataEnd - curPtr, false, payloadStart);

        m_pesData.resize(0);
        m_priorityData.clear();
        if (updateIdx)
        {
            PMTIndex& curIndex = *streamInfo.m_index.rbegin();
            assert(curIndex.rbegin()->second.m_frameLen == 0);
            curIndex.rbegin()->second.m_frameLen = (tsPackets + 1) * m_frameSize;
        }
    }
}